

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorReplaceThreshold(gdImagePtr im,int src,int dst,float threshold)

{
  int iVar1;
  int local_30;
  int local_2c;
  int n;
  int y;
  int x;
  float threshold_local;
  int dst_local;
  int src_local;
  gdImagePtr im_local;
  
  local_30 = 0;
  if (src == dst) {
    im_local._4_4_ = 0;
  }
  else {
    if (im->trueColor == 0) {
      for (local_2c = im->cy1; local_2c <= im->cy2; local_2c = local_2c + 1) {
        for (n = im->cx1; n <= im->cx2; n = n + 1) {
          iVar1 = gdColorMatch(im,src,(uint)im->pixels[local_2c][n],threshold);
          if (iVar1 != 0) {
            gdImageSetPixel(im,n,local_2c,dst);
            local_30 = local_30 + 1;
          }
        }
      }
    }
    else {
      for (local_2c = im->cy1; local_2c <= im->cy2; local_2c = local_2c + 1) {
        for (n = im->cx1; n <= im->cx2; n = n + 1) {
          iVar1 = gdColorMatch(im,src,im->tpixels[local_2c][n],threshold);
          if (iVar1 != 0) {
            gdImageSetPixel(im,n,local_2c,dst);
            local_30 = local_30 + 1;
          }
        }
      }
    }
    im_local._4_4_ = local_30;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceThreshold (gdImagePtr im, int src, int dst, float threshold)
{
	register int x, y;
	int n = 0;

	if (src == dst) {
		return 0;
	}

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				if (gdColorMatch(im, src, pixel(im, x, y), threshold)) { \
					gdImageSetPixel(im, x, y, dst);						\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	return n;
}